

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_data.cpp
# Opt level: O0

region_ptr __thiscall
cornelich::vanilla_data::data_for
          (vanilla_data *this,int32_t cycle,int32_t thread_id,int32_t file_number,bool for_write)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  byte in_R9B;
  region_ptr rVar2;
  long local_68;
  byte local_60;
  long *local_58;
  anon_class_16_2_bab76156 *creator;
  undefined1 local_3c [8];
  tuple<int,_int,_int> key;
  lock_guard<cornelich::util::spin_lock> lk;
  int32_t iStack_20;
  bool for_write_local;
  int32_t file_number_local;
  int32_t thread_id_local;
  int32_t cycle_local;
  vanilla_data *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,cycle);
  iStack_20 = file_number;
  file_number_local = thread_id;
  _thread_id_local = lVar1;
  this_local = this;
  std::lock_guard<cornelich::util::spin_lock>::lock_guard
            ((lock_guard<cornelich::util::spin_lock> *)
             &key.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Head_base<1UL,_int,_false>,(mutex_type *)(lVar1 + 0xc));
  std::make_tuple<int&,int&,int&>((int *)local_3c,&file_number_local,&stack0xffffffffffffffe0);
  local_58 = &local_68;
  local_68 = lVar1;
  local_60 = in_R9B & 1;
  util::
  cache<std::tuple<int,int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>
  ::get<cornelich::vanilla_data::data_for(int,int,int,bool)::__0&>
            ((cache<std::tuple<int,int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>
              *)this,(tuple<int,_int,_int> *)(lVar1 + 0x10),(anon_class_16_2_bab76156 *)local_3c);
  std::lock_guard<cornelich::util::spin_lock>::~lock_guard
            ((lock_guard<cornelich::util::spin_lock> *)
             &key.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Head_base<1UL,_int,_false>);
  rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (region_ptr)rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

region_ptr vanilla_data::data_for(std::int32_t cycle, std::int32_t thread_id, std::int32_t file_number, bool for_write)
{
    std::lock_guard<mutex_t> lk(m_lock);
    auto key = std::make_tuple(cycle, thread_id, file_number);
    auto && creator = [this, for_write](const key_t & k)
    {
        auto cycle_ = std::get<0>(k);
        auto thread_id_ = std::get<1>(k);
        auto file_number_ = std::get<2>(k);
        auto && path = make_file(m_settings.path(),
                                 m_settings.cycle_format().date_from_cycle(cycle_),
                                 (util::streamer() << DATA_FILE_NAME_PREFIX << thread_id_ << '-' << file_number_).str(),
                                 for_write);
        return !path.empty()
                ? std::make_shared<region>(path, 1LL << m_data_block_size_bits, file_number_)
                : region_ptr();
    };

    return m_cache.get(key, creator);
}